

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateRegisterInterfaces(HelicsFederate fed,char *file,HelicsError *err)

{
  Federate *this;
  HelicsError *in_RDX;
  long in_RSI;
  Federate *fedObj;
  HelicsError *in_stack_ffffffffffffff98;
  HelicsFederate in_stack_ffffffffffffffa0;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  this = getFed(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (this != (Federate *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RDX,-4,"Invalid File specification");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      (*this->_vptr_Federate[0xf])(this,&stack0xffffffffffffffc0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::allocator<char>::~allocator(&local_41);
    }
  }
  return;
}

Assistant:

void helicsFederateRegisterInterfaces(HelicsFederate fed, const char* file, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    if (file == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidFile);
        return;
    }
    try {
        fedObj->registerInterfaces(file);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}